

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.c
# Opt level: O0

HT_ErrorCode ht_tcp_listener_init(HT_TCPListener *listener,int port,size_t buffer_size)

{
  HT_Boolean HVar1;
  HT_Mutex *pHVar2;
  HT_TCPServer *pHVar3;
  HT_ErrorCode error_code;
  size_t buffer_size_local;
  int port_local;
  HT_TCPListener *listener_local;
  
  listener_local._4_4_ = ht_listener_buffer_init(&listener->_buffer,buffer_size);
  if (listener_local._4_4_ == HT_ERR_OK) {
    listener->_last_client_sock_fd = 0;
    listener->_was_flushed = 0;
    pHVar2 = ht_mutex_create();
    listener->_push_action_mutex = pHVar2;
    pHVar3 = ht_tcp_server_create();
    listener->_tcp_server = pHVar3;
    HVar1 = ht_tcp_server_start(listener->_tcp_server,port,ht_tcp_listener_client_connected,listener
                               );
    if (HVar1 == 0) {
      listener_local._4_4_ = HT_ERR_CANT_START_TCP_SERVER;
    }
    else {
      listener_local._4_4_ = HT_ERR_OK;
    }
  }
  return listener_local._4_4_;
}

Assistant:

static HT_ErrorCode
ht_tcp_listener_init(HT_TCPListener* listener, int port, size_t buffer_size)
{
    HT_ErrorCode error_code = ht_listener_buffer_init(&listener->_buffer, buffer_size);
    if (error_code != HT_ERR_OK)
    {
        return error_code;
    }

    listener->_last_client_sock_fd = 0;
    listener->_was_flushed = HT_FALSE;

    // TODO handle if return null
    listener->_push_action_mutex = ht_mutex_create();
    listener->_tcp_server = ht_tcp_server_create();

    if (ht_tcp_server_start(listener->_tcp_server, port, ht_tcp_listener_client_connected, listener))
    {
        return HT_ERR_OK;
    }

    return HT_ERR_CANT_START_TCP_SERVER;
}